

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

bool __thiscall String::toBool(String *this)

{
  usize *puVar1;
  char cVar2;
  usize uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  String local_40;
  
  uVar3 = this->data->len;
  bVar7 = true;
  if (uVar3 != 0) {
    local_40.data = &local_40._data;
    local_40._data.ref = 0;
    local_40._data.str = "false";
    local_40._data.len = 5;
    if (this->data->len == 5) {
      iVar4 = compareIgnoreCase(this,&local_40);
      if (iVar4 == 0) goto LAB_0010a25f;
    }
    if (this->data->len == 1) {
      iVar4 = Memory::compare(this->data->str,"0",1);
      bVar7 = iVar4 == 0;
    }
    else {
      bVar7 = false;
    }
  }
LAB_0010a25f:
  if ((uVar3 != 0) && ((local_40.data)->ref != 0)) {
    LOCK();
    puVar1 = &(local_40.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_40.data != (Data *)0x0)) {
      operator_delete__(local_40.data);
    }
  }
  if (bVar7) {
LAB_0010a28b:
    bVar7 = false;
  }
  else {
    pcVar5 = operator_cast_to_char_(this);
    do {
      pcVar6 = pcVar5 + 1;
      cVar2 = *pcVar5;
      pcVar5 = pcVar6;
    } while (cVar2 == '0');
    if (cVar2 == '.') {
      do {
        pcVar5 = pcVar6;
        pcVar6 = pcVar5 + 1;
      } while (*pcVar5 == '0');
      if ((*pcVar5 == '\0') && ((pcVar5[-1] == '0' || (*this->data->str == '0'))))
      goto LAB_0010a28b;
    }
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool toBool() const
  {
    if(data->len == 0 || equalsIgnoreCase("false") || *this == "0")
      return false;
    const char* p = *this;
    for(; *p == '0'; ++p);
    if(*p == '.')
    {
      for(++p; *p == '0'; ++p);
      if(!*p && (p[-1] == '0' || *data->str == '0'))
        return false;
    }
    return true;
  }